

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_run_end(ConsoleReporter *this,TestRunStats *p)

{
  int iVar1;
  int iVar2;
  _Setw _Var3;
  uint *puVar4;
  ostream *poVar5;
  ostream *poVar6;
  int *in_RSI;
  long in_RDI;
  double dVar7;
  int numSkipped;
  bool anythingFailed;
  int failwidth;
  int passwidth;
  int totwidth;
  undefined8 in_stack_ffffffffffffff48;
  Enum code;
  char *pcVar8;
  ostream *in_stack_ffffffffffffff50;
  uint local_2c;
  int local_28;
  uint local_24;
  uint local_20;
  int local_1c;
  uint local_18;
  int local_14;
  int *local_10;
  
  code = (Enum)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  if (((*(byte *)(*(long *)(in_RDI + 0x60) + 0x70) & 1) == 0) || (in_RSI[3] != 0)) {
    local_10 = in_RSI;
    separator_to_stream((ConsoleReporter *)0x11fafb);
    std::ostream::operator<<(*(void **)(in_RDI + 8),std::dec);
    local_18 = local_10[4];
    puVar4 = std::max<unsigned_int>((uint *)(local_10 + 1),&local_18);
    dVar7 = log10((double)(*puVar4 + 1));
    dVar7 = ceil(dVar7);
    local_14 = (int)dVar7;
    local_20 = local_10[1] - local_10[3];
    local_24 = local_10[4] - local_10[5];
    puVar4 = std::max<unsigned_int>(&local_20,&local_24);
    dVar7 = log10((double)(*puVar4 + 1));
    dVar7 = ceil(dVar7);
    local_1c = (int)dVar7;
    local_2c = local_10[5];
    puVar4 = std::max<unsigned_int>((uint *)(local_10 + 3),&local_2c);
    dVar7 = log10((double)(*puVar4 + 1));
    dVar7 = ceil(dVar7);
    local_28 = (int)dVar7;
    poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
    std::operator<<(poVar5,"[doctest] ");
    poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
    poVar5 = std::operator<<(poVar5,"test cases: ");
    _Var3 = std::setw(local_14);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_10[1]);
    std::operator<<(poVar5," | ");
    poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
    _Var3 = std::setw(local_1c);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_10[1] - local_10[3]);
    std::operator<<(poVar5," passed");
    poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
    std::operator<<(poVar5," | ");
    poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
    _Var3 = std::setw(local_28);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_10[3]);
    std::operator<<(poVar5," failed");
    poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
    std::operator<<(poVar5," |");
    if ((*(byte *)(*(long *)(in_RDI + 0x60) + 0x7f) & 1) == 0) {
      iVar1 = *local_10;
      iVar2 = local_10[1];
      std::operator<<(*(ostream **)(in_RDI + 8)," ");
      poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1 - iVar2);
      std::operator<<(poVar5," skipped");
      Color::operator<<(in_stack_ffffffffffffff50,code);
    }
    std::operator<<(*(ostream **)(in_RDI + 8),"\n");
    poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
    std::operator<<(poVar5,"[doctest] ");
    poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
    poVar5 = std::operator<<(poVar5,"assertions: ");
    _Var3 = std::setw(local_14);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_10[4]);
    std::operator<<(poVar5," | ");
    poVar5 = Color::operator<<(in_stack_ffffffffffffff50,code);
    _Var3 = std::setw(local_1c);
    poVar6 = std::operator<<(poVar5,_Var3);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10[4] - local_10[5]);
    std::operator<<(poVar6," passed");
    poVar6 = Color::operator<<(poVar5,code);
    std::operator<<(poVar6," | ");
    poVar6 = Color::operator<<(poVar5,code);
    _Var3 = std::setw(local_28);
    poVar6 = std::operator<<(poVar6,_Var3);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10[5]);
    std::operator<<(poVar6," failed");
    poVar6 = Color::operator<<(poVar5,code);
    std::operator<<(poVar6," |\n");
    poVar6 = Color::operator<<(poVar5,code);
    std::operator<<(poVar6,"[doctest] ");
    poVar6 = Color::operator<<(poVar5,code);
    std::operator<<(poVar6,"Status: ");
    poVar6 = Color::operator<<(poVar5,code);
    if (local_10[3] == 0) {
      pcVar8 = "SUCCESS!";
    }
    else {
      pcVar8 = "FAILURE!";
    }
    std::operator<<(poVar6,pcVar8);
    poVar5 = Color::operator<<(poVar5,(Enum)((ulong)pcVar8 >> 0x20));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            if(opt.minimal && p.numTestCasesFailed == 0)
                return;

            separator_to_stream();
            s << std::dec;

            auto totwidth = int(std::ceil(log10((std::max(p.numTestCasesPassingFilters, static_cast<unsigned>(p.numAsserts))) + 1)));
            auto passwidth = int(std::ceil(log10((std::max(p.numTestCasesPassingFilters - p.numTestCasesFailed, static_cast<unsigned>(p.numAsserts - p.numAssertsFailed))) + 1)));
            auto failwidth = int(std::ceil(log10((std::max(p.numTestCasesFailed, static_cast<unsigned>(p.numAssertsFailed))) + 1)));
            const bool anythingFailed = p.numTestCasesFailed > 0 || p.numAssertsFailed > 0;
            s << Color::Cyan << "[doctest] " << Color::None << "test cases: " << std::setw(totwidth)
              << p.numTestCasesPassingFilters << " | "
              << ((p.numTestCasesPassingFilters == 0 || anythingFailed) ? Color::None :
                                                                          Color::Green)
              << std::setw(passwidth) << p.numTestCasesPassingFilters - p.numTestCasesFailed << " passed"
              << Color::None << " | " << (p.numTestCasesFailed > 0 ? Color::Red : Color::None)
              << std::setw(failwidth) << p.numTestCasesFailed << " failed" << Color::None << " |";
            if(opt.no_skipped_summary == false) {
                const int numSkipped = p.numTestCases - p.numTestCasesPassingFilters;
                s << " " << (numSkipped == 0 ? Color::None : Color::Yellow) << numSkipped
                  << " skipped" << Color::None;
            }
            s << "\n";
            s << Color::Cyan << "[doctest] " << Color::None << "assertions: " << std::setw(totwidth)
              << p.numAsserts << " | "
              << ((p.numAsserts == 0 || anythingFailed) ? Color::None : Color::Green)
              << std::setw(passwidth) << (p.numAsserts - p.numAssertsFailed) << " passed" << Color::None
              << " | " << (p.numAssertsFailed > 0 ? Color::Red : Color::None) << std::setw(failwidth)
              << p.numAssertsFailed << " failed" << Color::None << " |\n";
            s << Color::Cyan << "[doctest] " << Color::None
              << "Status: " << (p.numTestCasesFailed > 0 ? Color::Red : Color::Green)
              << ((p.numTestCasesFailed > 0) ? "FAILURE!" : "SUCCESS!") << Color::None << std::endl;
        }